

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgregoriancalendar.cpp
# Opt level: O1

optional<long_long> QGregorianCalendar::julianFromParts(int year,int month,int day)

{
  undefined8 in_RAX;
  undefined4 extraout_var;
  long lVar1;
  _Storage<long_long,_true> _Var2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  undefined8 uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  optional<long_long> oVar10;
  optional<long_long> oVar11;
  
  oVar10.super__Optional_base<long_long,_true,_true>._M_payload.
  super__Optional_payload_base<long_long>._M_payload._1_7_ = (undefined7)((ulong)in_RAX >> 8);
  oVar10.super__Optional_base<long_long,_true,_true>._M_payload.
  super__Optional_payload_base<long_long>._M_payload._M_value._0_1_ = year == 0;
  if (0 < day && year != 0) {
    _Var2._0_4_ = monthLength(month,year);
    _Var2._M_value._4_4_ = extraout_var;
    if (_Var2._0_4_ < day) {
      uVar6 = 0;
    }
    else {
      iVar4 = month + 9;
      if (2 < month) {
        iVar4 = month + -3;
      }
      iVar9 = (year - (year >> 0x1f)) - (uint)(month < 3);
      uVar3 = (ulong)iVar9;
      if (iVar9 < 0) {
        lVar1 = uVar3 + 4;
        if (-1 < (long)(uVar3 + 1)) {
          lVar1 = uVar3 + 1;
        }
        uVar8 = (lVar1 >> 2) - 1;
      }
      else {
        uVar8 = uVar3 >> 2;
      }
      if (iVar9 < 0) {
        lVar1 = SUB168(SEXT816((long)(uVar3 + 1)) * SEXT816(-0x5c28f5c28f5c28f5),8) + uVar3 + 1;
        uVar7 = ((lVar1 >> 6) - (lVar1 >> 0x3f)) - 1;
      }
      else {
        uVar7 = uVar3 / 100;
      }
      if (iVar9 < 0) {
        lVar1 = SUB168(SEXT816((long)(uVar3 + 1)) * SEXT816(-0x5c28f5c28f5c28f5),8) + uVar3 + 1;
        uVar5 = ((lVar1 >> 8) - (lVar1 >> 0x3f)) - 1;
      }
      else {
        uVar5 = uVar3 / 400;
      }
      _Var2._M_value =
           (((ulong)(uint)day + uVar3 * 0x16d + uVar8 + (ulong)(iVar4 * 0x99 + 2) / 5) - uVar7) +
           uVar5 + 0x1a431f;
      uVar6 = CONCAT71((int7)(uVar5 >> 8),1);
    }
    oVar11.super__Optional_base<long_long,_true,_true>._M_payload.
    super__Optional_payload_base<long_long>._8_8_ = uVar6;
    oVar11.super__Optional_base<long_long,_true,_true>._M_payload.
    super__Optional_payload_base<long_long>._M_payload._M_value = _Var2._M_value;
    return (optional<long_long>)
           oVar11.super__Optional_base<long_long,_true,_true>._M_payload.
           super__Optional_payload_base<long_long>;
  }
  oVar10.super__Optional_base<long_long,_true,_true>._M_payload.
  super__Optional_payload_base<long_long>._8_8_ = 0;
  return (optional<long_long>)
         oVar10.super__Optional_base<long_long,_true,_true>._M_payload.
         super__Optional_payload_base<long_long>;
}

Assistant:

bool QGregorianCalendar::validParts(int year, int month, int day)
{
    return year && 0 < day && day <= monthLength(month, year);
}